

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O0

econf_err setStringValueNum(econf_file *ef,size_t num,void *v)

{
  char *pcVar1;
  char *local_40;
  char *ptr;
  char *value;
  void *v_local;
  size_t num_local;
  econf_file *ef_local;
  
  local_40 = (char *)v;
  if (v == (void *)0x0) {
    local_40 = "";
  }
  pcVar1 = strdup(local_40);
  if (pcVar1 == (char *)0x0) {
    ef_local._4_4_ = ECONF_NOMEM;
  }
  else {
    if (ef->file_entry[num].value != (char *)0x0) {
      free(ef->file_entry[num].value);
    }
    ef->file_entry[num].value = pcVar1;
    ef_local._4_4_ = ECONF_SUCCESS;
  }
  return ef_local._4_4_;
}

Assistant:

econf_err setStringValueNum(econf_file *ef, size_t num, const void *v) {
  const char *value = (const char*) (v ? v : "");
  char *ptr;

  if ((ptr = strdup (value)) == NULL)
    return ECONF_NOMEM;

  if (ef->file_entry[num].value)
    free(ef->file_entry[num].value);

  ef->file_entry[num].value = ptr;

  return ECONF_SUCCESS;
}